

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3_create_filename(char *zDatabase,char *zJournal,char *zWal,int nParam,char **azParam)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  undefined4 *puVar4;
  char *pcVar5;
  ulong uVar6;
  sqlite3_uint64 n;
  char *p;
  ulong uVar7;
  
  sVar1 = strlen(zDatabase);
  sVar2 = strlen(zJournal);
  sVar3 = strlen(zWal);
  n = sVar3 + sVar2 + sVar1 + 10;
  uVar6 = 0;
  uVar7 = (ulong)(uint)(nParam * 2);
  if (nParam * 2 < 1) {
    uVar7 = uVar6;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    sVar1 = strlen(azParam[uVar6]);
    n = n + sVar1 + 1;
  }
  puVar4 = (undefined4 *)sqlite3_malloc64(n);
  if (puVar4 == (undefined4 *)0x0) {
    p = (char *)0x0;
  }
  else {
    *puVar4 = 0;
    p = (char *)(puVar4 + 1);
    pcVar5 = appendText(p,zDatabase);
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      pcVar5 = appendText(pcVar5,azParam[uVar6]);
    }
    *pcVar5 = '\0';
    pcVar5 = appendText(pcVar5 + 1,zJournal);
    pcVar5 = appendText(pcVar5,zWal);
    pcVar5[0] = '\0';
    pcVar5[1] = '\0';
  }
  return p;
}

Assistant:

SQLITE_API char *sqlite3_create_filename(
  const char *zDatabase,
  const char *zJournal,
  const char *zWal,
  int nParam,
  const char **azParam
){
  sqlite3_int64 nByte;
  int i;
  char *pResult, *p;
  nByte = strlen(zDatabase) + strlen(zJournal) + strlen(zWal) + 10;
  for(i=0; i<nParam*2; i++){
    nByte += strlen(azParam[i])+1;
  }
  pResult = p = sqlite3_malloc64( nByte );
  if( p==0 ) return 0;
  memset(p, 0, 4);
  p += 4;
  p = appendText(p, zDatabase);
  for(i=0; i<nParam*2; i++){
    p = appendText(p, azParam[i]);
  }
  *(p++) = 0;
  p = appendText(p, zJournal);
  p = appendText(p, zWal);
  *(p++) = 0;
  *(p++) = 0;
  assert( (sqlite3_int64)(p - pResult)==nByte );
  return pResult + 4;
}